

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoplus.cpp
# Opt level: O1

void __thiscall EOPlus::Quest::Quest(Quest *this,istream *is)

{
  _Rb_tree_header *p_Var1;
  Parser parser;
  deque<EOPlus::Token,_std::allocator<EOPlus::Token>_> tokens;
  Lexer lexer;
  Parser PStack_118;
  _Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_> local_108;
  Lexer local_b8;
  _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> local_58;
  _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> local_38;
  
  this->has_info = false;
  (this->info).name._M_dataplus._M_p = (pointer)&(this->info).name.field_2;
  (this->info).name._M_string_length = 0;
  (this->info).name.field_2._M_local_buf[0] = '\0';
  (this->info).version = 0;
  (this->info).hidden = NotHidden;
  (this->info).disabled = false;
  p_Var1 = &(this->states)._M_t._M_impl.super__Rb_tree_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>::_M_initialize_map(&local_108,0);
  Lexer::Lexer(&local_b8,is);
  Lexer::Lex<std::back_insert_iterator<std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>>>
            (&local_b8,(deque<EOPlus::Token,_std::allocator<EOPlus::Token>_> *)&local_108);
  local_38._M_cur = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_38._M_first = local_108._M_impl.super__Deque_impl_data._M_start._M_first;
  local_38._M_last = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
  local_38._M_node = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
  local_58._M_cur = local_108._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first = local_108._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58._M_last = local_108._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58._M_node = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
  Parser::Parser<std::_Deque_iterator<EOPlus::Token,EOPlus::Token&,EOPlus::Token*>>
            (&PStack_118,this,&local_38,&local_58);
  Parser::ParseGlobal(&PStack_118);
  if (PStack_118.tok._M_t.
      super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
      ._M_t.
      super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
      .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
       )0x0) {
    (*(*(_func_int ***)
        PStack_118.tok._M_t.
        super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
        ._M_t.
        super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
        .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl)[2])();
  }
  std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::~deque(&local_b8.token_buffer.c);
  std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::~deque
            ((deque<EOPlus::Token,_std::allocator<EOPlus::Token>_> *)&local_108);
  return;
}

Assistant:

Quest::Quest(std::istream &is)
		: has_info(false)
	{
		std::deque<Token> tokens;

		Lexer lexer(is);
		lexer.Lex(std::back_inserter(tokens));

		Parser parser(*this, UTIL_RANGE(tokens));
		parser.ParseGlobal();
	}